

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

int * floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,int *A,int *B,int del)

{
  int iVar1;
  int *local_48;
  int *output;
  long posts;
  long i;
  int del_local;
  int *B_local;
  int *A_local;
  vorbis_look_floor1 *look_local;
  vorbis_block *vb_local;
  
  iVar1 = look->posts;
  local_48 = (int *)0x0;
  if ((A != (int *)0x0) && (B != (int *)0x0)) {
    local_48 = (int *)_vorbis_block_alloc(vb,(long)iVar1 << 2);
    for (posts = 0; posts < iVar1; posts = posts + 1) {
      local_48[posts] =
           (int)((0x10000 - del) * (A[posts] & 0x7fffU) + del * (B[posts] & 0x7fffU) + 0x8000) >>
           0x10;
      if (((A[posts] & 0x8000U) != 0) && ((B[posts] & 0x8000U) != 0)) {
        local_48[posts] = local_48[posts] | 0x8000;
      }
    }
  }
  return local_48;
}

Assistant:

int *floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          int *A,int *B,
                          int del){

  long i;
  long posts=look->posts;
  int *output=NULL;

  if(A && B){
    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    /* overly simpleminded--- look again post 1.2 */
    for(i=0;i<posts;i++){
      output[i]=((65536-del)*(A[i]&0x7fff)+del*(B[i]&0x7fff)+32768)>>16;
      if(A[i]&0x8000 && B[i]&0x8000)output[i]|=0x8000;
    }
  }

  return(output);
}